

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDopTest.cpp
# Opt level: O0

void __thiscall
KDopTest_testoverlappedNeg_Test::KDopTest_testoverlappedNeg_Test
          (KDopTest_testoverlappedNeg_Test *this)

{
  KDopTest_testoverlappedNeg_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__KDopTest_testoverlappedNeg_Test_00194e50;
  return;
}

Assistant:

TEST(KDopTest, testoverlappedNeg)
{
    TVertices triangle1 =
    {
        {3, 1, 0},
        {1, 5, 0},
        {5, 4, 0}
    };

    TVertices triangle2 =
    {
        {4, 1, 0},
        {5, 2, 0},
        {7, 1, 0}
    };

    KDop<16> bv1;
    for (unsigned i = 0; i < 3; ++i)
    {
        bv1 += triangle1[i];
    }

    KDop<16> bv2;
    for (unsigned i = 0; i < 3; ++i)
    {
        bv2 += triangle2[i];
    }

    EXPECT_FALSE(bv1.overlapped(bv2));
}